

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0283(ParserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  LanguageExtensions *pLVar2;
  ParseOptions *pPVar3;
  LanguageExtensions local_278;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 local_268;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 aStack_260;
  ParseOptions local_258;
  undefined8 local_238;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 aStack_230;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 local_228;
  undefined8 uStack_220;
  allocator<psy::C::SyntaxKind> local_209;
  SyntaxKind local_208 [20];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"void x ( y , z ) int y ; int z ; { }",&local_31);
  Expectation::Expectation(&local_1b8);
  local_208[8] = ParameterDeclaration;
  local_208[9] = IdentifierDeclarator;
  local_208[10] = ExtKR_ParameterDeclaration;
  local_208[0xb] = BasicTypeSpecifier;
  local_208[0xc] = IdentifierDeclarator;
  local_208[0xd] = ExtKR_ParameterDeclaration;
  local_208[0xe] = BasicTypeSpecifier;
  local_208[0xf] = IdentifierDeclarator;
  local_208[0] = STARTof_Node;
  local_208[1] = FunctionDefinition;
  local_208[2] = VoidTypeSpecifier;
  local_208[3] = FunctionDeclarator;
  local_208[4] = IdentifierDeclarator;
  local_208[5] = ParameterSuffix;
  local_208[6] = ParameterDeclaration;
  local_208[7] = IdentifierDeclarator;
  local_208[0x10] = 0x469;
  local_1e0 = local_208;
  local_1d8 = 0x11;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_209);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_209);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions(&local_258);
  LanguageExtensions::LanguageExtensions(&local_278);
  pLVar2 = LanguageExtensions::enable_extC_KandRStyle(&local_278,true);
  local_268 = (pLVar2->translations_).field_0;
  aStack_260 = pLVar2->field_1;
  pPVar3 = ParseOptions::withLanguageExtensions(&local_258,*pLVar2);
  local_238 = *(undefined8 *)pPVar3;
  aStack_230 = (pPVar3->langExts_).translations_.field_0;
  local_228 = (pPVar3->langExts_).field_1;
  uStack_220 = *(undefined8 *)&pPVar3->field_2;
  parse(this,&local_30,&local_100,Any,*pPVar3);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_209);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case0283()
{
    parse("void x ( y , z ) int y ; int z ; { }",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::FunctionDefinition,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ExtKR_ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ExtKR_ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::CompoundStatement }),
          SyntaxTree::SyntaxCategory::Any,
          ParseOptions().withLanguageExtensions(
              LanguageExtensions().enable_extC_KandRStyle(true)));
}